

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_deconvolution_activation(NetOptimize *this)

{
  string *__lhs;
  int iVar1;
  Layer *pLVar2;
  int *piVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  undefined4 *puVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  Mat *pMVar11;
  ulong uVar12;
  ulong local_88;
  Mat local_70;
  
  uVar10 = (ulong)((long)(this->super_Net).layers.
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar9 = (int)uVar10;
  uVar8 = 0;
  if (0 < iVar9) {
    uVar8 = uVar10 & 0xffffffff;
  }
  local_88 = 1;
  uVar10 = 0;
  do {
    if (uVar10 == uVar8) {
      return 0;
    }
    bVar7 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar10]->type,"Deconvolution")
    ;
    if (!bVar7) {
      iVar1 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar12 = local_88; (int)uVar12 < iVar9; uVar12 = uVar12 + 1) {
        bVar7 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar12]->type,"ReLU");
        if ((((!bVar7) ||
             (bVar7 = std::operator!=(&(this->super_Net).layers.
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                      "Clip"), !bVar7)) ||
            (bVar7 = std::operator!=(&(this->super_Net).layers.
                                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                     "Sigmoid"), !bVar7)) &&
           ((pLVar2 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12],
            piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar3 == 4 && (*piVar3 == iVar1)))) {
          if ((int)uVar12 != iVar9) {
            ppLVar4 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar2 = ppLVar4[uVar10];
            pLVar5 = ppLVar4[uVar12 & 0xffffffff];
            fprintf(_stderr,"fuse_deconvolution_activation %s %s\n",(pLVar2->name)._M_dataplus._M_p)
            ;
            __lhs = &pLVar5->type;
            bVar7 = std::operator==(__lhs,"ReLU");
            if (bVar7) {
              if ((*(float *)&pLVar5[1]._vptr_Layer != 0.0) ||
                 (NAN(*(float *)&pLVar5[1]._vptr_Layer))) {
                *(undefined4 *)((long)&pLVar2[1].name.field_2 + 4) = 2;
                ncnn::Mat::Mat(&local_70,1,4,(Allocator *)0x0);
                pMVar11 = (Mat *)((long)&pLVar2[1].name.field_2 + 8);
                ncnn::Mat::operator=(pMVar11,&local_70);
                ncnn::Mat::~Mat(&local_70);
                *(undefined4 *)pMVar11->data = *(undefined4 *)&pLVar5[1]._vptr_Layer;
              }
              else {
                *(undefined4 *)((long)&pLVar2[1].name.field_2 + 4) = 1;
              }
            }
            else {
              bVar7 = std::operator==(__lhs,"Clip");
              if (bVar7) {
                *(undefined4 *)((long)&pLVar2[1].name.field_2 + 4) = 3;
                ncnn::Mat::Mat(&local_70,2,4,(Allocator *)0x0);
                pMVar11 = (Mat *)((long)&pLVar2[1].name.field_2 + 8);
                ncnn::Mat::operator=(pMVar11,&local_70);
                ncnn::Mat::~Mat(&local_70);
                puVar6 = (undefined4 *)pMVar11->data;
                *puVar6 = *(undefined4 *)&pLVar5[1]._vptr_Layer;
                puVar6[1] = *(undefined4 *)((long)&pLVar5[1]._vptr_Layer + 4);
              }
              else {
                bVar7 = std::operator==(__lhs,"Sigmoid");
                if (bVar7) {
                  *(undefined4 *)((long)&pLVar2[1].name.field_2 + 4) = 4;
                }
              }
            }
            iVar1 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
            (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar1].producer = (int)uVar10;
            std::__cxx11::string::assign((char *)__lhs);
          }
          break;
        }
      }
    }
    uVar10 = uVar10 + 1;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolution_activation()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Deconvolution")
            continue;

        // Deconvolution - Activation
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Deconvolution - Activation to Deconvolution
        ncnn::Deconvolution* deconvolution = (ncnn::Deconvolution*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_deconvolution_activation %s %s\n", deconvolution->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                deconvolution->activation_type = 1;
            }
            else
            {
                deconvolution->activation_type = 2;
                deconvolution->activation_params = ncnn::Mat(1);
                deconvolution->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            deconvolution->activation_type = 3;
            deconvolution->activation_params = ncnn::Mat(2);
            deconvolution->activation_params[0] = clip->min;
            deconvolution->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            deconvolution->activation_type = 4;
        }

        int top_blob_index_final = activation->tops[0];
        deconvolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}